

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_geometry.cpp
# Opt level: O2

bool dxil_spv::emit_view_id_instruction(Impl *impl,CallInst *instruction)

{
  Id arg;
  Builder *this;
  Operation *this_00;
  
  this = Converter::Impl::builder(impl);
  arg = SPIRVModule::get_builtin_shader_input(impl->spirv_module,BuiltInViewIndex);
  this_00 = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction);
  Operation::add_id(this_00,arg);
  Converter::Impl::add(impl,this_00,false);
  spv::Builder::addCapability(this,CapabilityMultiView);
  return true;
}

Assistant:

bool emit_view_id_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id var_id = impl.spirv_module.get_builtin_shader_input(spv::BuiltInViewIndex);
	Operation *op = impl.allocate(spv::OpLoad, instruction);
	op->add_id(var_id);
	impl.add(op);
	builder.addCapability(spv::CapabilityMultiView);
	return true;
}